

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::SetAccessorOrNonWritableProperty
               (Var receiver,RecyclableObject *object,PropertyId propertyId,Var newValue,
               PropertyValueInfo *info,ScriptContext *requestContext,
               PropertyOperationFlags propertyOperationFlags,bool isRoot,
               bool allowUndecInConsoleScope,BOOL *result)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  InlineCacheFlags IVar4;
  PropertyIndex PVar5;
  uint uVar6;
  BOOL BVar7;
  RecyclableObject *pRVar8;
  undefined4 *puVar9;
  UnscopablesWrapperObject *this;
  RecyclableObject *object_00;
  Type *typeWithoutProperty;
  JavascriptProxy *this_00;
  bool local_d1;
  JavascriptProxy *proxy;
  RecyclableObject *func;
  undefined1 local_a0 [4];
  DescriptorFlags receiverFlags;
  PropertyValueInfo receiverInfo;
  Var receiverSetter;
  bool receiverNonWritable;
  Var pvStack_50;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  bool allowUndecInConsoleScope_local;
  ScriptContext *pSStack_40;
  bool isRoot_local;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var newValue_local;
  RecyclableObject *pRStack_20;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  setterValueOrProxy._7_1_ = isRoot;
  setterValueOrProxy._6_1_ = allowUndecInConsoleScope;
  *result = 0;
  pvStack_50 = (Var)0x0;
  receiverSetter._4_4_ = 0;
  receiverSetter._3_1_ = false;
  pSStack_40 = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)newValue;
  newValue_local._4_4_ = propertyId;
  pRStack_20 = object;
  object_local = (RecyclableObject *)receiver;
  if (((RecyclableObject *)receiver != object) && (!isRoot)) {
    receiverInfo.inlineCacheIndex = 0;
    receiverInfo.isFunctionPIC = false;
    receiverInfo.allowResizingPolymorphicInlineCache = false;
    receiverInfo._62_2_ = 0;
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_a0);
    pRVar8 = VarTo<Js::RecyclableObject>(object_local);
    uVar6 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x10])
                      (pRVar8,(ulong)newValue_local._4_4_,&receiverInfo.inlineCacheIndex,local_a0,
                       pSStack_40);
    local_d1 = (uVar6 & 2) == 2 && (uVar6 & 4) == 0;
    receiverSetter._3_1_ = local_d1;
  }
  if ((((setterValueOrProxy._7_1_ & 1) != 0) &&
      (BVar7 = CheckPrototypesForAccessorOrNonWritableRootProperty
                         (pRStack_20,newValue_local._4_4_,&stack0xffffffffffffffb0,
                          (DescriptorFlags *)((long)&receiverSetter + 4),
                          (PropertyValueInfo *)requestContext_local,pSStack_40), BVar7 != 0)) ||
     (((setterValueOrProxy._7_1_ & 1) == 0 &&
      ((BVar7 = CheckPrototypesForAccessorOrNonWritableProperty
                          (pRStack_20,newValue_local._4_4_,&stack0xffffffffffffffb0,
                           (DescriptorFlags *)((long)&receiverSetter + 4),
                           (PropertyValueInfo *)requestContext_local,pSStack_40), BVar7 != 0 ||
       ((receiverSetter._3_1_ & 1) != 0)))))) {
    if ((receiverSetter._4_4_ & 1) == 1) {
      bVar3 = JavascriptError::ThrowIfUndefinedSetter
                        (propertyOperationFlags,pvStack_50,pSStack_40,newValue_local._4_4_);
      if (bVar3) {
        *result = 1;
        return true;
      }
      if (pvStack_50 != (Var)0x0) {
        pRVar8 = VarTo<Js::RecyclableObject>(pvStack_50);
        if (((requestContext_local != (ScriptContext *)0x0) &&
            (IVar4 = PropertyValueInfo::GetFlags((PropertyValueInfo *)requestContext_local),
            IVar4 != InlineCacheSetterFlag)) &&
           (PVar5 = PropertyValueInfo::GetPropertyIndex((PropertyValueInfo *)requestContext_local),
           PVar5 != 0xffff)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xaa3,
                                      "(!info || info->GetFlags() == InlineCacheSetterFlag || info->GetPropertyIndex() == Constants::NoSlot)"
                                      ,
                                      "!info || info->GetFlags() == InlineCacheSetterFlag || info->GetPropertyIndex() == Constants::NoSlot"
                                     );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        bVar3 = VarIs<Js::UnscopablesWrapperObject>(object_local);
        if (bVar3) {
          this = UnsafeVarTo<Js::UnscopablesWrapperObject>(object_local);
          object_local = UnscopablesWrapperObject::GetWrappedObject(this);
        }
        else {
          bVar3 = IsUndefinedAccessor(pvStack_50,pSStack_40);
          if (!bVar3) {
            object_00 = VarTo<Js::RecyclableObject>(object_local);
            bVar2 = setterValueOrProxy._7_1_;
            typeWithoutProperty = RecyclableObject::GetType(pRStack_20);
            CacheOperators::CachePropertyWrite
                      (object_00,(bool)(bVar2 & 1),typeWithoutProperty,newValue_local._4_4_,
                       (PropertyValueInfo *)requestContext_local,pSStack_40);
          }
        }
        CallSetter(pRVar8,object_local,info_local,pSStack_40);
      }
      *result = 1;
      return true;
    }
    if ((receiverSetter._4_4_ & 0x10) == 0x10) {
      bVar3 = VarIs<Js::JavascriptProxy>(pvStack_50);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xaba,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                    "VarIs<JavascriptProxy>(setterValueOrProxy)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      this_00 = VarTo<Js::JavascriptProxy>(pvStack_50);
      PropertyValueInfo::SetNoCache
                ((PropertyValueInfo *)requestContext_local,(RecyclableObject *)this_00);
      PropertyValueInfo::DisablePrototypeCache
                ((PropertyValueInfo *)requestContext_local,(RecyclableObject *)this_00);
      BVar7 = Js::JavascriptProxy::SetPropertyTrap
                        (this_00,object_local,SetPropertyKind,newValue_local._4_4_,info_local,
                         pSStack_40,propertyOperationFlags,0);
      *result = BVar7;
      return true;
    }
    if ((((receiverSetter._4_4_ & 2) != 2) || ((receiverSetter._4_4_ & 4) != 0)) &&
       ((receiverSetter._3_1_ & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xac6,
                                  "(((flags & Data) == Data && (flags & Writable) == None) || receiverNonWritable)"
                                  ,
                                  "((flags & Data) == Data && (flags & Writable) == None) || receiverNonWritable"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if ((setterValueOrProxy._6_1_ & 1) == 0) {
      if ((receiverSetter._4_4_ & 8) == 0) {
        JavascriptError::ThrowCantAssign(propertyOperationFlags,pSStack_40,newValue_local._4_4_);
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,pSStack_40);
        *result = 0;
        return true;
      }
      JavascriptError::ThrowTypeError(pSStack_40,-0x7ff5fbe1,(PCWSTR)0x0);
    }
  }
  return false;
}

Assistant:

bool JavascriptOperators::SetAccessorOrNonWritableProperty(
        Var receiver,
        RecyclableObject* object,
        PropertyId propertyId,
        Var newValue,
        PropertyValueInfo * info,
        ScriptContext* requestContext,
        PropertyOperationFlags propertyOperationFlags,
        bool isRoot,
        bool allowUndecInConsoleScope,
        BOOL *result)
    {
        *result = FALSE;
        Var setterValueOrProxy = nullptr;
        DescriptorFlags flags = None;
        bool receiverNonWritable = false;

        if (receiver != object && !isRoot)
        {
            Var receiverSetter = nullptr;
            PropertyValueInfo receiverInfo;
            DescriptorFlags receiverFlags = VarTo<RecyclableObject>(receiver)->GetSetter(propertyId, &receiverSetter, &receiverInfo, requestContext);
            receiverNonWritable = ((receiverFlags & Data) == Data && (receiverFlags & Writable) == None);
        }

        if ((isRoot && JavascriptOperators::CheckPrototypesForAccessorOrNonWritableRootProperty(object, propertyId, &setterValueOrProxy, &flags, info, requestContext)) ||
            (!isRoot && (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableProperty(object, propertyId, &setterValueOrProxy, &flags, info, requestContext) ||
            receiverNonWritable)))
        {
            if ((flags & Accessor) == Accessor)
            {
                if (JavascriptError::ThrowIfUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext, propertyId))
                {
                    *result = TRUE;
                    return true;
                }
                if (setterValueOrProxy)
                {
                    RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                    Assert(!info || info->GetFlags() == InlineCacheSetterFlag || info->GetPropertyIndex() == Constants::NoSlot);

                    if (VarIs<UnscopablesWrapperObject>(receiver))
                    {
                        receiver = (UnsafeVarTo<UnscopablesWrapperObject>(receiver))->GetWrappedObject();
                    }
                    else if (!JavascriptOperators::IsUndefinedAccessor(setterValueOrProxy, requestContext))
                    {
                        CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), isRoot, object->GetType(), propertyId, info, requestContext);
                    }
#ifdef ENABLE_MUTATION_BREAKPOINT
                    if (MutationBreakpoint::IsFeatureEnabled(requestContext))
                    {
                        MutationBreakpoint::HandleSetProperty(requestContext, object, propertyId, newValue);
                    }
#endif
                    JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                }
                *result = TRUE;
                return true;
            }
            else if ((flags & Proxy) == Proxy)
            {
                Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                // We can't cache the property at this time. both target and handler can be changed outside of the proxy, so the inline cache needs to be
                // invalidate when target, handler, or handler prototype has changed. We don't have a way to achieve this yet.
                PropertyValueInfo::SetNoCache(info, proxy);
                PropertyValueInfo::DisablePrototypeCache(info, proxy); // We can't cache prototype property either

                *result = proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetPropertyKind, propertyId, newValue, requestContext, propertyOperationFlags);
                return true;
            }
            else
            {
                Assert(((flags & Data) == Data && (flags & Writable) == None) || receiverNonWritable);
                if (!allowUndecInConsoleScope)
                {
                    if (flags & Const)
                    {
                        JavascriptError::ThrowTypeError(requestContext, ERRAssignmentToConst);
                    }

                    JavascriptError::ThrowCantAssign(propertyOperationFlags, requestContext, propertyId);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);

                    *result = FALSE;
                    return true;
                }
            }
        }
        return false;
    }